

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.cpp
# Opt level: O0

void operator_delete__(void *ptr,size_t sz,align_val_t al)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long *in_FS_OFFSET;
  align_val_t al_local;
  size_t sz_local;
  void *ptr_local;
  unsigned_long local_c0 [2];
  align_val_t local_b0;
  anon_class_8_1_3fcf64e9 local_a8;
  align_val_t local_a0;
  anon_class_8_1_3fcf64e9 local_98;
  align_val_t local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  long local_78;
  void *local_70;
  void *pageStart;
  size_t idx;
  size_t memForbidden;
  size_t offsetInPage;
  long local_48;
  undefined8 *local_40;
  uintptr_t meaningfulBits;
  uintptr_t meaningfulBitsMask;
  uintptr_t padr;
  undefined8 *local_18;
  void *local_10;
  
  local_90 = al;
  local_88 = (undefined8 *)ptr;
  if (*(long *)(*in_FS_OFFSET + -0x20) == 0) {
    local_a8.al = &local_90;
    local_c0[1] = 0x20;
    local_c0[0] = 0x10;
    local_b0 = al;
    puVar1 = std::max<unsigned_long>(local_c0 + 1,local_c0);
    ptr_local = (void *)0x8;
    puVar1 = std::max<unsigned_long>(puVar1,(unsigned_long *)&ptr_local);
    nodecpp::assert::
    nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)2,operator_delete_impl(void*,std::align_val_t)::_lambda()_2_,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
               ,0x9d,&local_a8,"(size_t)al <= NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW","{} vs. {}",
               &local_b0,puVar1);
    local_10 = local_88;
    free(local_88);
  }
  else {
    local_98.al = &local_90;
    local_a0 = al;
    nodecpp::assert::
    nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)2,operator_delete_impl(void*,std::align_val_t)::_lambda()_1_,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
               ,0x98,&local_98,"(size_t)al <= ThreadLocalAllocatorT::maximalSupportedAlignment",
               "{} vs. {}",&local_a0,
               &nodecpp::iibmalloc::IibAllocatorBase::maximalSupportedAlignment);
    local_78 = *(long *)(*in_FS_OFFSET + -0x20);
    local_80 = local_88;
    offsetInPage = (size_t)local_88;
    if (local_88 != (undefined8 *)0x0) {
      local_40 = local_88;
      memForbidden = (ulong)local_88 & 0xfff;
      idx = 0x20;
      if (memForbidden == 0x20) {
        local_18 = local_88;
        local_70 = (void *)((ulong)local_88 & 0xfffffffffffff000);
        local_48 = local_78;
        nodecpp::iibmalloc::
        BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>::
        deallocate((BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>
                    *)(local_78 + 0x200),local_70);
      }
      else {
        uVar2 = ((ulong)local_88 >> 0xc & 0x7ff) >> 5;
        *local_88 = *(undefined8 *)(local_78 + uVar2 * 8);
        *(undefined8 **)(local_78 + uVar2 * 8) = local_88;
      }
    }
  }
  return;
}

Assistant:

void operator delete[]( void* ptr, std::size_t sz, std::align_val_t al ) noexcept
{
	operator_delete_impl(ptr, al);
}